

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseAttribs(NSVGparser *p,char **attr)

{
  int iVar1;
  int local_1c;
  int i;
  char **attr_local;
  NSVGparser *p_local;
  
  for (local_1c = 0; attr[local_1c] != (char *)0x0; local_1c = local_1c + 2) {
    iVar1 = strcmp(attr[local_1c],"style");
    if (iVar1 == 0) {
      nsvg__parseStyle(p,attr[local_1c + 1]);
    }
    else {
      nsvg__parseAttr(p,attr[local_1c],attr[local_1c + 1]);
    }
  }
  return;
}

Assistant:

static void nsvg__parseAttribs(NSVGparser* p, const char** attr)
{
	int i;
	for (i = 0; attr[i]; i += 2)
	{
		if (strcmp(attr[i], "style") == 0)
			nsvg__parseStyle(p, attr[i + 1]);
		else
			nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}
}